

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int32 stat_mtime(char *file)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat statbuf;
  char *file_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)file;
  iVar1 = stat(file,(stat *)local_a8);
  if (iVar1 == 0) {
    file_local._4_4_ = (int32)statbuf.st_atim.tv_nsec;
  }
  else {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

int32
stat_mtime(const char *file)
{
    struct stat statbuf;

#ifdef HAVE_SYS_STAT_H
    if (stat(file, &statbuf) != 0)
        return -1;
#else /* HAVE_SYS_STAT_H */
    if (stat_retry(file, &statbuf) != 0)
        return -1;
#endif /* HAVE_SYS_STAT_H */

    return ((int32) statbuf.st_mtime);
}